

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[10],int&>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],int *params_1)

{
  char (*value) [10];
  kj *this_00;
  int *value_00;
  CappedArray<char,_14UL> local_48;
  ArrayPtr<const_char> local_30;
  char (*local_20) [10];
  int *params_local_1;
  char (*params_local) [10];
  
  local_20 = params;
  params_local_1 = (int *)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_30 = toCharSequence<char_const(&)[10]>(value);
  this_00 = (kj *)fwd<int&>((int *)local_20);
  toCharSequence<int&>(&local_48,this_00,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}